

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::solve_inequality
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *this)

{
  pointer *ppnVar1;
  int iVar2;
  uint uVar3;
  pointer piVar4;
  pointer pcVar5;
  undefined8 uVar6;
  bool bVar7;
  float *pfVar8;
  pointer piVar9;
  pointer pnVar10;
  ptrdiff_t _Num;
  long lVar11;
  ulong uVar12;
  float fVar13;
  
  piVar9 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->lower_bound = -INFINITY;
  lVar11 = (long)piVar4 - (long)piVar9;
  if (lVar11 == 0) {
    fVar13 = 0.0;
  }
  else {
    fVar13 = 0.0;
    lVar11 = (lVar11 >> 3) * -0x5555555555555555;
    do {
      pfVar8 = &piVar9->r;
      piVar9 = piVar9 + 1;
      lVar11 = lVar11 + -1;
      uVar6 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)*pfVar8),1);
      bVar7 = (bool)((byte)uVar6 & 1);
      fVar13 = (float)((uint)bVar7 * (int)(fVar13 + *pfVar8) + (uint)!bVar7 * (int)fVar13);
    } while (lVar11 != 0);
  }
  this->upper_bound = fVar13;
  make_init_node_0(this);
  pnVar10 = (this->nodes).
            super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pnVar10[-1].sumfactor;
  if (this->b_max < iVar2 || iVar2 < this->b_min) {
    if (this->b_max < iVar2) {
      uVar3 = pnVar10[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar3);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar3) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar3;
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar10[-1].sumr;
    uVar12 = (ulong)(this->subvector).m_element_size;
    if (uVar12 != 0) {
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar5 + this->solution,pcVar5 + pnVar10[-1].variables,uVar12);
    }
  }
  make_init_node_1(this);
  pnVar10 = (this->nodes).
            super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pnVar10[-1].sumfactor;
  if (this->b_max < iVar2 || iVar2 < this->b_min) {
    if (this->b_max < iVar2) {
      uVar3 = pnVar10[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar3);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar3) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar3;
      pnVar10 = (this->nodes).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->nodes).
      super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
      ._M_impl.super__Vector_impl_data._M_finish = pnVar10;
    }
  }
  else {
    this->upper_bound = pnVar10[-1].sumr;
    uVar12 = (ulong)(this->subvector).m_element_size;
    if (uVar12 != 0) {
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar5 + this->solution,pcVar5 + pnVar10[-1].variables,uVar12);
      pnVar10 = (this->nodes).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if ((this->nodes).
      super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
      ._M_impl.super__Vector_impl_data._M_start != pnVar10) {
    do {
      make_next_inequality_node(this);
    } while ((this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void solve_inequality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        make_init_node_1();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_inequality_node();
    }